

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall V2Transport::StartSendingHandshake(V2Transport *this)

{
  long lVar1;
  pointer puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_send_buffer,
             (size_type)
             ((this->m_send_garbage).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
             (0x40 - (long)(this->m_send_garbage).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start)));
  puVar2 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined4 *)(this->m_cipher).m_our_pubkey.m_pubkey._M_elems;
  uVar4 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 4);
  uVar5 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 8);
  uVar6 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0xc);
  uVar7 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x10);
  uVar8 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x14);
  uVar9 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x18);
  uVar10 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x1c);
  uVar11 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x20);
  uVar12 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x24);
  uVar13 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x28);
  uVar14 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x2c);
  uVar15 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x34);
  uVar16 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x38);
  uVar17 = *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x3c);
  *(undefined4 *)(puVar2 + 0x30) =
       *(undefined4 *)((this->m_cipher).m_our_pubkey.m_pubkey._M_elems + 0x30);
  *(undefined4 *)(puVar2 + 0x34) = uVar15;
  *(undefined4 *)(puVar2 + 0x38) = uVar16;
  *(undefined4 *)(puVar2 + 0x3c) = uVar17;
  *(undefined4 *)(puVar2 + 0x20) = uVar11;
  *(undefined4 *)(puVar2 + 0x24) = uVar12;
  *(undefined4 *)(puVar2 + 0x28) = uVar13;
  *(undefined4 *)(puVar2 + 0x2c) = uVar14;
  *(undefined4 *)(puVar2 + 0x10) = uVar7;
  *(undefined4 *)(puVar2 + 0x14) = uVar8;
  *(undefined4 *)(puVar2 + 0x18) = uVar9;
  *(undefined4 *)(puVar2 + 0x1c) = uVar10;
  *(undefined4 *)puVar2 = uVar3;
  *(undefined4 *)(puVar2 + 4) = uVar4;
  *(undefined4 *)(puVar2 + 8) = uVar5;
  *(undefined4 *)(puVar2 + 0xc) = uVar6;
  puVar2 = (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->m_send_garbage).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2;
  if (__n == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    memmove((this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start + 0x40,puVar2,__n);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void V2Transport::StartSendingHandshake() noexcept
{
    AssertLockHeld(m_send_mutex);
    Assume(m_send_state == SendState::AWAITING_KEY);
    Assume(m_send_buffer.empty());
    // Initialize the send buffer with ellswift pubkey + provided garbage.
    m_send_buffer.resize(EllSwiftPubKey::size() + m_send_garbage.size());
    std::copy(std::begin(m_cipher.GetOurPubKey()), std::end(m_cipher.GetOurPubKey()), MakeWritableByteSpan(m_send_buffer).begin());
    std::copy(m_send_garbage.begin(), m_send_garbage.end(), m_send_buffer.begin() + EllSwiftPubKey::size());
    // We cannot wipe m_send_garbage as it will still be used as AAD later in the handshake.
}